

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::DeadBranchElimPass::AddBranch
          (DeadBranchElimPass *this,uint32_t labelId,BasicBlock *bp)

{
  Analysis AVar1;
  Instruction *pIVar2;
  mapped_type *ppBVar3;
  IRContext *pIVar4;
  Instruction *local_a0;
  undefined1 local_98 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pIVar4 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar4);
  }
  pIVar2 = analysis::DefUseManager::GetDef
                     ((pIVar4->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,labelId);
  if (pIVar2 != (Instruction *)0x0) {
    pIVar2 = (Instruction *)operator_new(0x70);
    pIVar4 = (this->super_MemPass).super_Pass.context_;
    local_70._24_8_ = local_70 + 0x10;
    local_70._0_8_ = &PTR__SmallVector_00b02ef8;
    local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_70._8_8_ = 1;
    local_a0 = (Instruction *)CONCAT44(local_a0._4_4_,1);
    local_98._0_8_ = &PTR__SmallVector_00b02ef8;
    local_98._8_8_ = 0;
    local_98._24_8_ = local_98 + 0x10;
    local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_70._16_4_ = labelId;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_98,(SmallVector<unsigned_int,_2UL> *)local_70
              );
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               &local_a0,local_70);
    Instruction::Instruction(pIVar2,pIVar4,OpBranch,0,0,(OperandList *)&local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    local_98._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_78,local_78._M_head_impl);
    }
    local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_70._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_50,local_50._M_head_impl);
    }
    pIVar4 = (this->super_MemPass).super_Pass.context_;
    AVar1 = pIVar4->valid_analyses_;
    if ((AVar1 & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar4->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,pIVar2);
      pIVar4 = (this->super_MemPass).super_Pass.context_;
      AVar1 = pIVar4->valid_analyses_;
    }
    local_a0 = pIVar2;
    if ((AVar1 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      ppBVar3 = std::__detail::
                _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pIVar4->instr_to_block_,&local_a0);
      *ppBVar3 = bp;
    }
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(bp->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar2);
    return;
  }
  __assert_fail("get_def_use_mgr()->GetDef(labelId) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                ,0x4e,"void spvtools::opt::DeadBranchElimPass::AddBranch(uint32_t, BasicBlock *)");
}

Assistant:

void DeadBranchElimPass::AddBranch(uint32_t labelId, BasicBlock* bp) {
  assert(get_def_use_mgr()->GetDef(labelId) != nullptr);
  std::unique_ptr<Instruction> newBranch(
      new Instruction(context(), spv::Op::OpBranch, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {labelId}}}));
  context()->AnalyzeDefUse(&*newBranch);
  context()->set_instr_block(&*newBranch, bp);
  bp->AddInstruction(std::move(newBranch));
}